

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O2

string * to_lower_case(string *__return_storage_ptr__,string *str)

{
  byte *pbVar1;
  byte *pbVar2;
  
  pbVar1 = (byte *)(str->_M_dataplus)._M_p;
  pbVar2 = pbVar1;
  for (; pbVar1 != pbVar2 + str->_M_string_length; pbVar1 = pbVar1 + 1) {
    if ((byte)(*pbVar1 + 0xbf) < 0x1a) {
      *pbVar1 = *pbVar1 | 0x20;
      pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string to_lower_case(std::string str) {
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    if(is_upper_case(*letter)) {
      *letter = to_lower_case(*letter);
    }
  }
  return str;
}